

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

bool embree::avx512::InstanceIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Instance *pIVar7;
  RTCPointQueryContext *pRVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  byte bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 uVar33;
  uint uVar34;
  uint uVar35;
  bool bVar36;
  AffineSpace3ff *pAVar37;
  long lVar38;
  int iVar39;
  AffineSpace3ff *unaff_R13;
  AffineSpace3ff *pAVar40;
  uint uVar41;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar48;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar49;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar50;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar42;
  uint uVar43;
  float fVar44;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  vfloat4 a0_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vfloat4 a0;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined4 uVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  vfloat4 a0_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar114;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  vfloat4 b0;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  vfloat4 a1;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 in_ZMM18 [64];
  undefined8 local_e8;
  undefined4 local_e0;
  float local_dc;
  float local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  PointQuery *local_98;
  int local_90;
  undefined1 local_88 [16];
  float local_78;
  void *local_70;
  undefined8 local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  auVar46 = in_ZMM18._0_16_;
  pIVar7 = prim->instance;
  if ((pIVar7->super_Geometry).numTimeSteps == 1) {
    pAVar37 = pIVar7->local2world;
    if ((pIVar7->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar73 = (pAVar37->p).field_0.m128[3];
      fVar114 = (pAVar37->l).vx.field_0.m128[3];
      fVar44 = (pAVar37->l).vy.field_0.m128[3];
      fVar92 = (pAVar37->l).vz.field_0.m128[3];
      auVar56 = vxorps_avx512vl(auVar46,auVar46);
      auVar46 = vshufps_avx512vl((undefined1  [16])(pAVar37->l).vx.field_0,auVar56,0xe9);
      auVar46 = vblendps_avx(auVar46,(undefined1  [16])(pAVar37->l).vy.field_0,4);
      auVar52 = vfmadd213ss_fma(ZEXT416((uint)fVar73),ZEXT416((uint)fVar73),
                                ZEXT416((uint)(fVar114 * fVar114)));
      auVar52 = vfnmadd231ss_fma(auVar52,ZEXT416((uint)fVar44),ZEXT416((uint)fVar44));
      auVar55 = vfnmadd231ss_fma(auVar52,ZEXT416((uint)fVar92),ZEXT416((uint)fVar92));
      auVar47 = ZEXT416((uint)fVar44);
      auVar54 = ZEXT416((uint)fVar114);
      auVar52 = vfmadd213ss_fma(auVar47,auVar54,ZEXT416((uint)(fVar73 * fVar92)));
      fVar11 = auVar52._0_4_ + auVar52._0_4_;
      auVar65 = ZEXT416((uint)fVar92);
      auVar52 = vfmsub213ss_fma(auVar65,auVar54,ZEXT416((uint)(fVar73 * fVar44)));
      fVar9 = auVar52._0_4_ + auVar52._0_4_;
      auVar52 = vfmsub231ss_fma(ZEXT416((uint)(fVar73 * fVar92)),auVar54,auVar47);
      fVar92 = auVar52._0_4_ + auVar52._0_4_;
      auVar53 = vfmsub231ss_fma(ZEXT416((uint)(fVar114 * fVar114)),ZEXT416((uint)fVar73),
                                ZEXT416((uint)fVar73));
      auVar52 = vfmadd213ss_fma(auVar47,auVar47,auVar53);
      auVar47 = vfnmadd231ss_fma(auVar52,auVar65,auVar65);
      auVar57 = ZEXT416((uint)fVar44);
      auVar52 = vfmadd213ss_fma(auVar65,auVar57,ZEXT416((uint)(fVar73 * fVar114)));
      fVar10 = auVar52._0_4_ + auVar52._0_4_;
      auVar52 = vfmadd213ss_fma(auVar54,auVar65,ZEXT416((uint)(fVar73 * fVar44)));
      fVar44 = auVar52._0_4_ + auVar52._0_4_;
      auVar52 = vfmsub231ss_fma(ZEXT416((uint)(fVar73 * fVar114)),auVar57,auVar65);
      fVar73 = auVar52._0_4_ + auVar52._0_4_;
      auVar52 = vfnmadd231ss_fma(auVar53,auVar57,auVar57);
      auVar54 = vfmadd231ss_fma(auVar52,auVar65,auVar65);
      uVar91 = auVar55._0_4_;
      auVar103._4_4_ = uVar91;
      auVar103._0_4_ = uVar91;
      auVar103._8_4_ = uVar91;
      auVar103._12_4_ = uVar91;
      auVar111._4_4_ = fVar11;
      auVar111._0_4_ = fVar11;
      auVar111._8_4_ = fVar11;
      auVar111._12_4_ = fVar11;
      auVar118._0_4_ = fVar9 * 0.0;
      auVar118._4_4_ = fVar9 * 0.0;
      auVar118._8_4_ = fVar9 * 1.0;
      auVar118._12_4_ = fVar9 * 0.0;
      auVar57 = ZEXT816(0x3f80000000000000);
      auVar52 = vfmadd231ps_fma(auVar118,auVar57,auVar111);
      auVar55 = SUB6416(ZEXT464(0x3f800000),0);
      auVar52 = vfmadd231ps_fma(auVar52,auVar55,auVar103);
      auVar104._4_4_ = fVar92;
      auVar104._0_4_ = fVar92;
      auVar104._8_4_ = fVar92;
      auVar104._12_4_ = fVar92;
      uVar91 = auVar47._0_4_;
      auVar122._4_4_ = uVar91;
      auVar122._0_4_ = uVar91;
      auVar122._8_4_ = uVar91;
      auVar122._12_4_ = uVar91;
      auVar131._0_4_ = fVar10 * 0.0;
      auVar131._4_4_ = fVar10 * 0.0;
      auVar131._8_4_ = fVar10 * 1.0;
      auVar131._12_4_ = fVar10 * 0.0;
      auVar53 = vfmadd231ps_fma(auVar131,auVar57,auVar122);
      auVar53 = vfmadd231ps_fma(auVar53,auVar55,auVar104);
      auVar95._4_4_ = fVar44;
      auVar95._0_4_ = fVar44;
      auVar95._8_4_ = fVar44;
      auVar95._12_4_ = fVar44;
      auVar82._4_4_ = fVar73;
      auVar82._0_4_ = fVar73;
      auVar82._8_4_ = fVar73;
      auVar82._12_4_ = fVar73;
      fVar73 = auVar54._0_4_;
      auVar105._0_4_ = fVar73 * 0.0;
      auVar105._4_4_ = fVar73 * 0.0;
      auVar105._8_4_ = fVar73 * 1.0;
      auVar105._12_4_ = fVar73 * 0.0;
      auVar54 = vfmadd231ps_fma(auVar105,auVar57,auVar82);
      auVar54 = vfmadd231ps_fma(auVar54,auVar55,auVar95);
      auVar46 = vaddps_avx512vl(auVar46,auVar56);
      auVar55 = vmulps_avx512vl(auVar54,auVar56);
      auVar47 = vfmadd213ps_avx512vl(auVar56,auVar53,auVar55);
      uVar91 = *(undefined4 *)&(pAVar37->l).vx.field_0;
      auVar24._4_4_ = uVar91;
      auVar24._0_4_ = uVar91;
      auVar24._8_4_ = uVar91;
      auVar24._12_4_ = uVar91;
      aVar48 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar47,auVar52,auVar24);
      uVar91 = *(undefined4 *)((long)&(pAVar37->l).vy.field_0 + 4);
      auVar25._4_4_ = uVar91;
      auVar25._0_4_ = uVar91;
      auVar25._8_4_ = uVar91;
      auVar25._12_4_ = uVar91;
      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar53,auVar25);
      uVar91 = *(undefined4 *)&(pAVar37->l).vy.field_0;
      auVar26._4_4_ = uVar91;
      auVar26._0_4_ = uVar91;
      auVar26._8_4_ = uVar91;
      auVar26._12_4_ = uVar91;
      aVar49 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar55,auVar52,auVar26);
      uVar91 = *(undefined4 *)((long)&(pAVar37->l).vz.field_0 + 8);
      auVar27._4_4_ = uVar91;
      auVar27._0_4_ = uVar91;
      auVar27._8_4_ = uVar91;
      auVar27._12_4_ = uVar91;
      auVar55 = vmulps_avx512vl(auVar54,auVar27);
      uVar91 = *(undefined4 *)((long)&(pAVar37->l).vz.field_0 + 4);
      auVar28._4_4_ = uVar91;
      auVar28._0_4_ = uVar91;
      auVar28._8_4_ = uVar91;
      auVar28._12_4_ = uVar91;
      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar53,auVar28);
      uVar91 = *(undefined4 *)&(pAVar37->l).vz.field_0;
      auVar29._4_4_ = uVar91;
      auVar29._0_4_ = uVar91;
      auVar29._8_4_ = uVar91;
      auVar29._12_4_ = uVar91;
      aVar50 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar55,auVar52,auVar29);
      uVar91 = *(undefined4 *)((long)&(pAVar37->p).field_0 + 8);
      auVar30._4_4_ = uVar91;
      auVar30._0_4_ = uVar91;
      auVar30._8_4_ = uVar91;
      auVar30._12_4_ = uVar91;
      auVar54 = vmulps_avx512vl(auVar54,auVar30);
      uVar91 = *(undefined4 *)((long)&(pAVar37->p).field_0 + 4);
      auVar31._4_4_ = uVar91;
      auVar31._0_4_ = uVar91;
      auVar31._8_4_ = uVar91;
      auVar31._12_4_ = uVar91;
      auVar53 = vfmadd231ps_avx512vl(auVar54,auVar53,auVar31);
      uVar91 = *(undefined4 *)&(pAVar37->p).field_0;
      auVar32._4_4_ = uVar91;
      auVar32._0_4_ = uVar91;
      auVar32._8_4_ = uVar91;
      auVar32._12_4_ = uVar91;
      auVar52 = vfmadd231ps_avx512vl(auVar53,auVar52,auVar32);
      aVar51 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vaddps_avx512vl(auVar46,auVar52);
    }
    else {
      aVar48 = (pAVar37->l).vx.field_0;
      aVar49 = (pAVar37->l).vy.field_0;
      aVar50 = (pAVar37->l).vz.field_0;
      aVar51 = (pAVar37->p).field_0;
    }
  }
  else {
    fVar73 = (pIVar7->super_Geometry).fnumTimeSegments;
    fVar114 = (pIVar7->super_Geometry).time_range.lower;
    fVar114 = fVar73 * ((query->time - fVar114) /
                       ((pIVar7->super_Geometry).time_range.upper - fVar114));
    auVar52 = vroundss_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),9);
    auVar52 = vminss_avx(auVar52,ZEXT416((uint)(fVar73 + -1.0)));
    auVar53._0_12_ = ZEXT812(0);
    auVar53._12_4_ = 0;
    auVar52 = vmaxss_avx(auVar53,auVar52);
    fVar114 = fVar114 - auVar52._0_4_;
    iVar39 = (int)auVar52._0_4_;
    pAVar37 = pIVar7->local2world + CONCAT44((int)((ulong)unaff_R13 >> 0x20),iVar39);
    unaff_R13 = pIVar7->local2world + (iVar39 + 1);
    if ((pIVar7->super_Geometry).field_8.field_0x1 == '\x01') {
      uVar35 = *(uint *)((long)&(pAVar37->p).field_0 + 0xc);
      uVar1 = *(uint *)((long)&(pAVar37->l).vx.field_0 + 0xc);
      uVar2 = *(uint *)((long)&(pAVar37->l).vy.field_0 + 0xc);
      uVar3 = *(uint *)((long)&(pAVar37->l).vz.field_0 + 0xc);
      uVar34 = *(uint *)((long)&(unaff_R13->p).field_0 + 0xc);
      uVar42 = *(uint *)((long)&(unaff_R13->l).vx.field_0 + 0xc);
      uVar43 = *(uint *)((long)&(unaff_R13->l).vy.field_0 + 0xc);
      uVar41 = *(uint *)((long)&(unaff_R13->l).vz.field_0 + 0xc);
      auVar52 = vmulss_avx512f(ZEXT416(uVar1),ZEXT416(uVar42));
      auVar52 = vfmadd231ss_avx512f(auVar52,ZEXT416(uVar35),ZEXT416(uVar34));
      auVar52 = vfmadd231ss_avx512f(auVar52,ZEXT416(uVar2),ZEXT416(uVar43));
      auVar53 = vfmadd231ss_avx512f(auVar52,ZEXT416(uVar3),ZEXT416(uVar41));
      auVar47._8_4_ = 0x80000000;
      auVar47._0_8_ = 0x8000000080000000;
      auVar47._12_4_ = 0x80000000;
      auVar57._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
      auVar57._8_4_ = auVar53._8_4_ ^ 0x80000000;
      auVar57._12_4_ = auVar53._12_4_ ^ 0x80000000;
      bVar36 = auVar53._0_4_ < -auVar53._0_4_;
      auVar52 = vxorps_avx512vl(ZEXT416(uVar34),auVar47);
      auVar54 = vxorps_avx512vl(ZEXT416(uVar42),auVar47);
      auVar55 = vxorps_avx512vl(ZEXT416(uVar43),auVar47);
      auVar47 = vxorps_avx512vl(ZEXT416(uVar41),auVar47);
      auVar56 = ZEXT416((uint)bVar36 * auVar52._0_4_ + !bVar36 * uVar34);
      auVar54 = ZEXT416((uint)bVar36 * auVar54._0_4_ + !bVar36 * uVar42);
      auVar55 = ZEXT416((uint)bVar36 * auVar55._0_4_ + !bVar36 * uVar43);
      auVar47 = ZEXT416((uint)bVar36 * auVar47._0_4_ + !bVar36 * uVar41);
      auVar57 = vmaxss_avx512f(auVar57,auVar53);
      auVar52._8_4_ = 0x7fffffff;
      auVar52._0_8_ = 0x7fffffff7fffffff;
      auVar52._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx512vl(auVar53,auVar52);
      auVar52 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar53,ZEXT416(0x3c9df1b8));
      auVar52 = vfmadd213ss_fma(auVar52,auVar53,ZEXT416(0xbd37e81c));
      auVar52 = vfmadd213ss_fma(auVar52,auVar53,ZEXT416(0x3db3edac));
      auVar52 = vfmadd213ss_fma(auVar52,auVar53,ZEXT416(0xbe5ba881));
      auVar52 = vfmadd213ss_fma(auVar52,auVar53,ZEXT416(0x3fc90fd1));
      auVar65 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
      if (auVar65._0_4_ < 0.0) {
        fVar73 = sqrtf(auVar65._0_4_);
        auVar57 = ZEXT416(auVar57._0_4_);
      }
      else {
        auVar65 = vsqrtss_avx(auVar65,auVar65);
        fVar73 = auVar65._0_4_;
      }
      auVar60 = ZEXT416((uint)fVar114);
      auVar52 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar73 * auVar52._0_4_)));
      uVar12 = vcmpss_avx512f(auVar57,ZEXT816(0) << 0x40,1);
      bVar36 = (bool)((byte)uVar12 & 1);
      auVar61 = ZEXT416(0x3f800000);
      uVar12 = vcmpss_avx512f(auVar61,auVar53,1);
      bVar14 = (bool)((byte)uVar12 & 1);
      fVar73 = fVar114 * (float)((uint)bVar14 * 0x7fc00000 +
                                (uint)!bVar14 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar36 * (auVar52._0_4_ ^ 0x80000000) +
                                            (uint)!bVar36 * auVar52._0_4_)));
      auVar52 = ZEXT416((uint)(fVar73 * 0.63661975));
      auVar52 = vroundss_avx(auVar52,auVar52,9);
      auVar53 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar52,ZEXT416((uint)fVar73));
      uVar34 = (int)auVar52._0_4_ & 3;
      uVar42 = uVar34 - 1;
      fVar44 = auVar53._0_4_;
      fVar73 = fVar44 * fVar44;
      auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar73),
                                ZEXT416(0x363938a8));
      auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar73),
                                ZEXT416(0x37cfab9c));
      auVar66 = ZEXT416((uint)fVar73);
      auVar53 = vfmadd213ss_fma(auVar53,auVar66,ZEXT416(0xb9501096));
      auVar65 = vfmadd213ss_fma(auVar65,auVar66,ZEXT416(0xbab60981));
      auVar53 = vfmadd213ss_fma(auVar53,auVar66,ZEXT416(0x3c088898));
      auVar65 = vfmadd213ss_fma(auVar65,auVar66,ZEXT416(0x3d2aaaa4));
      auVar66 = ZEXT416((uint)fVar73);
      auVar53 = vfmadd213ss_fma(auVar53,auVar66,ZEXT416(0xbe2aaaab));
      auVar65 = vfmadd213ss_fma(auVar65,auVar66,SUB6416(ZEXT464(0xbf000000),0));
      auVar53 = vfmadd213ss_avx512f(auVar53,auVar66,auVar61);
      auVar65 = vfmadd213ss_avx512f(auVar65,auVar66,auVar61);
      fVar44 = fVar44 * auVar53._0_4_;
      bVar13 = (byte)(int)auVar52._0_4_;
      uVar43 = (uint)(bVar13 & 1) * auVar65._0_4_ + (uint)!(bool)(bVar13 & 1) * (int)fVar44;
      auVar67._4_12_ = auVar65._4_12_;
      uVar41 = (uint)(bVar13 & 1) * (int)fVar44 + (uint)!(bool)(bVar13 & 1) * auVar65._0_4_;
      fVar44 = (float)((uint)(1 < uVar34) * (uVar43 ^ 0x80000000) + (1 >= uVar34) * uVar43);
      auVar67._0_4_ = (uint)(uVar42 < 2) * (uVar41 ^ 0x80000000) + (uVar42 >= 2) * uVar41;
      auVar53 = vfmsub213ss_avx512f(ZEXT416(uVar35),auVar57,auVar56);
      auVar52 = vfmsub213ss_avx512f(ZEXT416(uVar1),auVar57,auVar54);
      auVar66 = vfmsub213ss_avx512f(ZEXT416(uVar2),auVar57,auVar55);
      auVar68 = vfmsub213ss_avx512f(ZEXT416(uVar3),auVar57,auVar47);
      fVar92 = auVar52._0_4_;
      auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * fVar92)),auVar53,auVar53);
      auVar52 = vfmadd231ss_fma(auVar52,auVar66,auVar66);
      auVar52 = vfmadd231ss_fma(auVar52,auVar68,auVar68);
      auVar58 = vxorps_avx512vl(auVar46,auVar46);
      auVar59._4_12_ = auVar58._4_12_;
      auVar59._0_4_ = auVar52._0_4_;
      auVar46 = vrsqrt14ss_avx512f(auVar58,auVar59);
      fVar73 = auVar46._0_4_;
      fVar73 = fVar73 * 1.5 + fVar73 * fVar73 * fVar73 * auVar52._0_4_ * -0.5;
      auVar57 = vfmsub231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar73 * fVar44)),auVar67,
                                ZEXT416(uVar35));
      auVar65 = vfmsub231ss_fma(ZEXT416((uint)(fVar92 * fVar73 * fVar44)),auVar67,ZEXT416(uVar1));
      auVar66 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar73 * fVar44)),auVar67,
                                ZEXT416(uVar2));
      auVar67 = vfmsub231ss_fma(ZEXT416((uint)(auVar68._0_4_ * fVar73 * fVar44)),ZEXT416(uVar3),
                                auVar67);
      auVar68 = vsubss_avx512f(auVar61,auVar60);
      auVar46 = vmulss_avx512f(auVar60,auVar56);
      auVar46 = vfmadd231ss_fma(auVar46,auVar68,ZEXT416(uVar35));
      auVar52 = vmulss_avx512f(auVar60,auVar54);
      auVar52 = vfmadd231ss_fma(auVar52,auVar68,ZEXT416(uVar1));
      auVar53 = vmulss_avx512f(auVar60,auVar55);
      auVar53 = vfmadd231ss_fma(auVar53,auVar68,ZEXT416(uVar2));
      auVar54 = vmulss_avx512f(auVar60,auVar47);
      auVar54 = vfmadd231ss_fma(auVar54,auVar68,ZEXT416(uVar3));
      fVar44 = auVar52._0_4_;
      auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44)),auVar46,auVar46);
      auVar52 = vfmadd231ss_fma(auVar52,auVar53,auVar53);
      auVar52 = vfmadd231ss_fma(auVar52,auVar54,auVar54);
      auVar55._4_12_ = auVar59._4_12_;
      auVar55._0_4_ = auVar52._0_4_;
      auVar55 = vrsqrt14ss_avx512f(auVar58,auVar55);
      fVar73 = auVar55._0_4_;
      fVar73 = fVar73 * 1.5 + fVar73 * fVar73 * fVar73 * auVar52._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar36 = 2 < uVar42;
      auVar60._4_12_ = auVar57._4_12_;
      auVar60._0_4_ =
           (float)((uint)bVar36 * (int)(auVar46._0_4_ * fVar73) + (uint)!bVar36 * auVar57._0_4_);
      auVar61._4_12_ = auVar65._4_12_;
      auVar61._0_4_ = (float)((uint)bVar36 * (int)(fVar44 * fVar73) + (uint)!bVar36 * auVar65._0_4_)
      ;
      auVar62._4_12_ = auVar66._4_12_;
      auVar62._0_4_ =
           (float)((uint)bVar36 * (int)(auVar53._0_4_ * fVar73) + (uint)!bVar36 * auVar66._0_4_);
      auVar63._4_12_ = auVar67._4_12_;
      auVar63._0_4_ =
           (float)((uint)bVar36 * (int)(auVar54._0_4_ * fVar73) + (uint)!bVar36 * auVar67._0_4_);
      auVar124._0_4_ = fVar114 * (unaff_R13->l).vx.field_0.m128[0];
      auVar124._4_4_ = fVar114 * (unaff_R13->l).vx.field_0.m128[1];
      auVar124._8_4_ = fVar114 * (unaff_R13->l).vx.field_0.m128[2];
      auVar124._12_4_ = fVar114 * (unaff_R13->l).vx.field_0.m128[3];
      uVar91 = auVar68._0_4_;
      auVar127._4_4_ = uVar91;
      auVar127._0_4_ = uVar91;
      auVar127._8_4_ = uVar91;
      auVar127._12_4_ = uVar91;
      auVar52 = vfmadd231ps_fma(auVar124,auVar127,(undefined1  [16])(pAVar37->l).vx.field_0);
      auVar119._0_4_ = fVar114 * (unaff_R13->l).vy.field_0.m128[0];
      auVar119._4_4_ = fVar114 * (unaff_R13->l).vy.field_0.m128[1];
      auVar119._8_4_ = fVar114 * (unaff_R13->l).vy.field_0.m128[2];
      auVar119._12_4_ = fVar114 * (unaff_R13->l).vy.field_0.m128[3];
      auVar53 = vfmadd231ps_fma(auVar119,auVar127,(undefined1  [16])(pAVar37->l).vy.field_0);
      auVar115._0_4_ = fVar114 * (unaff_R13->l).vz.field_0.m128[0];
      auVar115._4_4_ = fVar114 * (unaff_R13->l).vz.field_0.m128[1];
      auVar115._8_4_ = fVar114 * (unaff_R13->l).vz.field_0.m128[2];
      auVar115._12_4_ = fVar114 * (unaff_R13->l).vz.field_0.m128[3];
      auVar54 = vfmadd231ps_fma(auVar115,auVar127,(undefined1  [16])(pAVar37->l).vz.field_0);
      auVar46._0_4_ = fVar114 * (unaff_R13->p).field_0.m128[0];
      auVar46._4_4_ = fVar114 * (unaff_R13->p).field_0.m128[1];
      auVar46._8_4_ = fVar114 * (unaff_R13->p).field_0.m128[2];
      auVar46._12_4_ = fVar114 * (unaff_R13->p).field_0.m128[3];
      auVar55 = vfmadd231ps_fma(auVar46,auVar127,(undefined1  [16])(pAVar37->p).field_0);
      auVar46 = vshufps_avx512vl(auVar52,auVar58,0xe9);
      auVar46 = vblendps_avx(auVar46,auVar53,4);
      auVar47 = vfmadd213ss_fma(auVar60,auVar60,ZEXT416((uint)(auVar61._0_4_ * auVar61._0_4_)));
      auVar47 = vfnmadd231ss_fma(auVar47,auVar62,auVar62);
      auVar65 = vfnmadd231ss_fma(auVar47,auVar63,auVar63);
      auVar47 = vfmadd213ss_fma(auVar62,auVar61,ZEXT416((uint)(auVar60._0_4_ * auVar63._0_4_)));
      fVar73 = auVar47._0_4_ + auVar47._0_4_;
      auVar47 = vfmsub213ss_fma(auVar63,auVar61,ZEXT416((uint)(auVar60._0_4_ * auVar62._0_4_)));
      fVar114 = auVar47._0_4_ + auVar47._0_4_;
      auVar47 = vfmsub231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar63._0_4_)),auVar61,auVar62);
      fVar44 = auVar47._0_4_ + auVar47._0_4_;
      auVar56 = vfmsub231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar61._0_4_)),auVar60,auVar60);
      auVar47 = vfmadd213ss_fma(auVar62,auVar62,auVar56);
      auVar66 = vfnmadd231ss_fma(auVar47,auVar63,auVar63);
      auVar47 = vfmadd213ss_avx512f(auVar63,auVar62,ZEXT416((uint)(auVar60._0_4_ * auVar61._0_4_)));
      auVar67 = vaddss_avx512f(auVar47,auVar47);
      auVar47 = vfmadd213ss_fma(auVar61,auVar63,ZEXT416((uint)(auVar60._0_4_ * auVar62._0_4_)));
      fVar92 = auVar47._0_4_ + auVar47._0_4_;
      auVar47 = vfmsub231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar61._0_4_)),auVar62,auVar63);
      fVar11 = auVar47._0_4_ + auVar47._0_4_;
      auVar47 = vfnmadd231ss_fma(auVar56,auVar62,auVar62);
      auVar57 = vfmadd231ss_fma(auVar47,auVar63,auVar63);
      uVar91 = auVar65._0_4_;
      auVar56._4_4_ = uVar91;
      auVar56._0_4_ = uVar91;
      auVar56._8_4_ = uVar91;
      auVar56._12_4_ = uVar91;
      auVar68._4_4_ = fVar73;
      auVar68._0_4_ = fVar73;
      auVar68._8_4_ = fVar73;
      auVar68._12_4_ = fVar73;
      auVar133._0_4_ = fVar114 * 0.0;
      auVar133._4_4_ = fVar114 * 0.0;
      auVar133._8_4_ = fVar114 * 1.0;
      auVar133._12_4_ = fVar114 * 0.0;
      auVar59 = ZEXT816(0x3f80000000000000);
      auVar47 = vfmadd231ps_fma(auVar133,auVar59,auVar68);
      auVar68 = SUB6416(ZEXT464(0x3f800000),0);
      auVar47 = vfmadd231ps_fma(auVar47,auVar68,auVar56);
      auVar65._4_4_ = fVar44;
      auVar65._0_4_ = fVar44;
      auVar65._8_4_ = fVar44;
      auVar65._12_4_ = fVar44;
      uVar91 = auVar66._0_4_;
      auVar83._4_4_ = uVar91;
      auVar83._0_4_ = uVar91;
      auVar83._8_4_ = uVar91;
      auVar83._12_4_ = uVar91;
      auVar56 = vbroadcastss_avx512vl(auVar67);
      auVar132._0_4_ = auVar56._0_4_ * 0.0;
      auVar132._4_4_ = auVar56._4_4_ * 0.0;
      auVar132._8_4_ = auVar56._8_4_ * 1.0;
      auVar132._12_4_ = auVar56._12_4_ * 0.0;
      auVar56 = vfmadd231ps_fma(auVar132,auVar59,auVar83);
      auVar56 = vfmadd231ps_fma(auVar56,auVar68,auVar65);
      auVar66._4_4_ = fVar92;
      auVar66._0_4_ = fVar92;
      auVar66._8_4_ = fVar92;
      auVar66._12_4_ = fVar92;
      auVar84._4_4_ = fVar11;
      auVar84._0_4_ = fVar11;
      auVar84._8_4_ = fVar11;
      auVar84._12_4_ = fVar11;
      fVar73 = auVar57._0_4_;
      auVar97._0_4_ = fVar73 * 0.0;
      auVar97._4_4_ = fVar73 * 0.0;
      auVar97._8_4_ = fVar73 * 1.0;
      auVar97._12_4_ = fVar73 * 0.0;
      auVar57 = vfmadd231ps_fma(auVar97,auVar59,auVar84);
      auVar57 = vfmadd231ps_fma(auVar57,auVar68,auVar66);
      auVar65 = vaddps_avx512vl(auVar46,auVar58);
      uVar91 = auVar52._0_4_;
      auVar85._4_4_ = uVar91;
      auVar85._0_4_ = uVar91;
      auVar85._8_4_ = uVar91;
      auVar85._12_4_ = uVar91;
      auVar46 = vmulps_avx512vl(auVar57,auVar58);
      auVar52 = vfmadd213ps_avx512vl(auVar58,auVar56,auVar46);
      aVar48 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar52,auVar47,auVar85);
      uVar91 = auVar53._0_4_;
      auVar58._4_4_ = uVar91;
      auVar58._0_4_ = uVar91;
      auVar58._8_4_ = uVar91;
      auVar58._12_4_ = uVar91;
      auVar52 = vshufps_avx512vl(auVar53,auVar53,0x55);
      auVar46 = vfmadd213ps_avx512vl(auVar52,auVar56,auVar46);
      aVar49 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar46,auVar47,auVar58);
      uVar91 = auVar54._0_4_;
      auVar86._4_4_ = uVar91;
      auVar86._0_4_ = uVar91;
      auVar86._8_4_ = uVar91;
      auVar86._12_4_ = uVar91;
      auVar46 = vshufps_avx(auVar54,auVar54,0x55);
      auVar52 = vshufps_avx(auVar54,auVar54,0xaa);
      auVar52 = vmulps_avx512vl(auVar52,auVar57);
      auVar46 = vfmadd231ps_avx512vl(auVar52,auVar56,auVar46);
      aVar50 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar46,auVar47,auVar86);
      uVar91 = auVar55._0_4_;
      auVar54._4_4_ = uVar91;
      auVar54._0_4_ = uVar91;
      auVar54._8_4_ = uVar91;
      auVar54._12_4_ = uVar91;
      auVar46 = vshufps_avx(auVar55,auVar55,0x55);
      auVar52 = vshufps_avx(auVar55,auVar55,0xaa);
      auVar98._0_4_ = auVar52._0_4_ * auVar57._0_4_;
      auVar98._4_4_ = auVar52._4_4_ * auVar57._4_4_;
      auVar98._8_4_ = auVar52._8_4_ * auVar57._8_4_;
      auVar98._12_4_ = auVar52._12_4_ * auVar57._12_4_;
      auVar46 = vfmadd231ps_fma(auVar98,auVar56,auVar46);
      auVar46 = vfmadd231ps_fma(auVar46,auVar47,auVar54);
      aVar51 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vaddps_avx512vl(auVar65,auVar46);
    }
    else {
      fVar73 = 1.0 - fVar114;
      auVar78._4_4_ = fVar114;
      auVar78._0_4_ = fVar114;
      auVar78._8_4_ = fVar114;
      auVar78._12_4_ = fVar114;
      auVar46 = vmulps_avx512vl(auVar78,(undefined1  [16])(unaff_R13->l).vx.field_0);
      auVar74._4_4_ = fVar73;
      auVar74._0_4_ = fVar73;
      auVar74._8_4_ = fVar73;
      auVar74._12_4_ = fVar73;
      aVar48.m128 = (__m128)vfmadd231ps_avx512vl(auVar46,auVar74,(pAVar37->l).vx.field_0);
      auVar46 = vmulps_avx512vl(auVar78,(undefined1  [16])(unaff_R13->l).vy.field_0);
      aVar49.m128 = (__m128)vfmadd231ps_avx512vl(auVar46,auVar74,(pAVar37->l).vy.field_0);
      auVar46 = vmulps_avx512vl(auVar78,(undefined1  [16])(unaff_R13->l).vz.field_0);
      aVar50.m128 = (__m128)vfmadd231ps_avx512vl(auVar46,auVar74,(pAVar37->l).vz.field_0);
      auVar46 = vmulps_avx512vl(auVar78,(undefined1  [16])(unaff_R13->p).field_0);
      aVar51.m128 = (__m128)vfmadd231ps_avx512vl(auVar46,auVar74,(pAVar37->p).field_0);
    }
  }
  if ((pIVar7->super_Geometry).numTimeSteps == 1) {
    aVar4 = (pIVar7->world2local0).l.vx.field_0;
    aVar5 = (pIVar7->world2local0).l.vy.field_0;
    aVar6 = (pIVar7->world2local0).l.vz.field_0;
    aVar45 = (pIVar7->world2local0).p.field_0;
  }
  else {
    fVar73 = (pIVar7->super_Geometry).fnumTimeSegments;
    fVar114 = (pIVar7->super_Geometry).time_range.lower;
    fVar114 = fVar73 * ((query->time - fVar114) /
                       ((pIVar7->super_Geometry).time_range.upper - fVar114));
    auVar46 = vroundss_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),9);
    auVar46 = vminss_avx(auVar46,ZEXT416((uint)(fVar73 + -1.0)));
    auVar79._0_12_ = ZEXT812(0);
    auVar79._12_4_ = 0;
    auVar46 = vmaxss_avx(auVar79,auVar46);
    fVar114 = fVar114 - auVar46._0_4_;
    iVar39 = (int)auVar46._0_4_;
    pAVar37 = pIVar7->local2world + CONCAT44((int)((ulong)unaff_R13 >> 0x20),iVar39);
    pAVar40 = pIVar7->local2world + (iVar39 + 1);
    if ((pIVar7->super_Geometry).field_8.field_0x1 == '\x01') {
      uVar35 = *(uint *)((long)&(pAVar37->p).field_0 + 0xc);
      uVar1 = *(uint *)((long)&(pAVar37->l).vx.field_0 + 0xc);
      uVar2 = *(uint *)((long)&(pAVar37->l).vy.field_0 + 0xc);
      uVar3 = *(uint *)((long)&(pAVar37->l).vz.field_0 + 0xc);
      uVar34 = *(uint *)((long)&(pAVar40->p).field_0 + 0xc);
      uVar42 = *(uint *)((long)&(pAVar40->l).vx.field_0 + 0xc);
      uVar43 = *(uint *)((long)&(pAVar40->l).vy.field_0 + 0xc);
      uVar41 = *(uint *)((long)&(pAVar40->l).vz.field_0 + 0xc);
      auVar46 = vmulss_avx512f(ZEXT416(uVar1),ZEXT416(uVar42));
      auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416(uVar35),ZEXT416(uVar34));
      auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416(uVar2),ZEXT416(uVar43));
      auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416(uVar3),ZEXT416(uVar41));
      auVar123._8_4_ = 0x80000000;
      auVar123._0_8_ = 0x8000000080000000;
      auVar123._12_4_ = 0x80000000;
      auVar96._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
      auVar96._8_4_ = auVar46._8_4_ ^ 0x80000000;
      auVar96._12_4_ = auVar46._12_4_ ^ 0x80000000;
      bVar36 = auVar46._0_4_ < -auVar46._0_4_;
      auVar52 = vxorps_avx512vl(ZEXT416(uVar34),auVar123);
      auVar53 = vxorps_avx512vl(ZEXT416(uVar42),auVar123);
      auVar54 = vxorps_avx512vl(ZEXT416(uVar43),auVar123);
      auVar55 = vxorps_avx512vl(ZEXT416(uVar41),auVar123);
      auVar52 = ZEXT416((uint)bVar36 * auVar52._0_4_ + !bVar36 * uVar34);
      auVar47 = ZEXT416((uint)bVar36 * auVar53._0_4_ + !bVar36 * uVar42);
      auVar54 = ZEXT416((uint)bVar36 * auVar54._0_4_ + !bVar36 * uVar43);
      auVar55 = ZEXT416((uint)bVar36 * auVar55._0_4_ + !bVar36 * uVar41);
      auVar56 = vmaxss_avx512f(auVar96,auVar46);
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx512vl(auVar46,auVar23);
      auVar46 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar53,ZEXT416(0x3c9df1b8));
      auVar46 = vfmadd213ss_fma(auVar46,auVar53,ZEXT416(0xbd37e81c));
      auVar46 = vfmadd213ss_fma(auVar46,auVar53,ZEXT416(0x3db3edac));
      auVar46 = vfmadd213ss_fma(auVar46,auVar53,ZEXT416(0xbe5ba881));
      auVar46 = vfmadd213ss_fma(auVar46,auVar53,ZEXT416(0x3fc90fd1));
      auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
      if (auVar57._0_4_ < 0.0) {
        local_c8 = auVar53;
        local_b8 = auVar52;
        fVar73 = sqrtf(auVar57._0_4_);
        auVar56 = ZEXT416(auVar56._0_4_);
        auVar52 = local_b8;
        auVar53 = local_c8;
      }
      else {
        auVar57 = vsqrtss_avx(auVar57,auVar57);
        fVar73 = auVar57._0_4_;
      }
      auVar68 = ZEXT416(uVar35);
      auVar67 = ZEXT416(0x3f800000);
      auVar59 = ZEXT416((uint)fVar114);
      auVar46 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar73 * auVar46._0_4_)));
      uVar12 = vcmpss_avx512f(auVar56,ZEXT816(0) << 0x40,1);
      bVar36 = (bool)((byte)uVar12 & 1);
      uVar12 = vcmpss_avx512f(auVar67,auVar53,1);
      bVar14 = (bool)((byte)uVar12 & 1);
      fVar73 = fVar114 * (float)((uint)bVar14 * 0x7fc00000 +
                                (uint)!bVar14 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar36 * (auVar46._0_4_ ^ 0x80000000) +
                                            (uint)!bVar36 * auVar46._0_4_)));
      auVar46 = ZEXT416((uint)(fVar73 * 0.63661975));
      auVar46 = vroundss_avx(auVar46,auVar46,9);
      auVar53 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar46,ZEXT416((uint)fVar73));
      uVar35 = (int)auVar46._0_4_ & 3;
      uVar34 = uVar35 - 1;
      fVar44 = auVar53._0_4_;
      fVar73 = fVar44 * fVar44;
      auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar73),
                                ZEXT416(0x363938a8));
      auVar57 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar73),
                                ZEXT416(0x37cfab9c));
      auVar65 = ZEXT416((uint)fVar73);
      auVar53 = vfmadd213ss_fma(auVar53,auVar65,ZEXT416(0xb9501096));
      auVar57 = vfmadd213ss_fma(auVar57,auVar65,ZEXT416(0xbab60981));
      auVar53 = vfmadd213ss_fma(auVar53,auVar65,ZEXT416(0x3c088898));
      auVar57 = vfmadd213ss_fma(auVar57,auVar65,ZEXT416(0x3d2aaaa4));
      auVar65 = ZEXT416((uint)fVar73);
      auVar53 = vfmadd213ss_fma(auVar53,auVar65,ZEXT416(0xbe2aaaab));
      auVar57 = vfmadd213ss_fma(auVar57,auVar65,SUB6416(ZEXT464(0xbf000000),0));
      auVar53 = vfmadd213ss_avx512f(auVar53,auVar65,auVar67);
      auVar57 = vfmadd213ss_avx512f(auVar57,auVar65,auVar67);
      fVar44 = fVar44 * auVar53._0_4_;
      bVar13 = (byte)(int)auVar46._0_4_;
      uVar42 = (uint)(bVar13 & 1) * auVar57._0_4_ + (uint)!(bool)(bVar13 & 1) * (int)fVar44;
      auVar64._4_12_ = auVar57._4_12_;
      uVar43 = (uint)(bVar13 & 1) * (int)fVar44 + (uint)!(bool)(bVar13 & 1) * auVar57._0_4_;
      fVar44 = (float)((uint)(1 < uVar35) * (uVar42 ^ 0x80000000) + (1 >= uVar35) * uVar42);
      auVar64._0_4_ = (uint)(uVar34 < 2) * (uVar43 ^ 0x80000000) + (uVar34 >= 2) * uVar43;
      auVar53 = vfmsub213ss_avx512f(auVar68,auVar56,auVar52);
      auVar46 = vfmsub213ss_avx512f(ZEXT416(uVar1),auVar56,auVar47);
      auVar57 = vfmsub213ss_avx512f(ZEXT416(uVar2),auVar56,auVar54);
      auVar65 = vfmsub213ss_avx512f(ZEXT416(uVar3),auVar56,auVar55);
      fVar92 = auVar46._0_4_;
      auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * fVar92)),auVar53,auVar53);
      auVar46 = vfmadd231ss_fma(auVar46,auVar57,auVar57);
      auVar46 = vfmadd231ss_fma(auVar46,auVar65,auVar65);
      auVar58 = ZEXT816(0) << 0x20;
      auVar56 = vrsqrt14ss_avx512f(auVar58,ZEXT416((uint)auVar46._0_4_));
      fVar73 = auVar56._0_4_;
      fVar73 = fVar73 * 1.5 + fVar73 * fVar73 * fVar73 * auVar46._0_4_ * -0.5;
      auVar66 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar73 * auVar53._0_4_ * fVar44)),auVar64,auVar68
                                   );
      auVar56 = vfmsub231ss_fma(ZEXT416((uint)(fVar73 * fVar92 * fVar44)),auVar64,ZEXT416(uVar1));
      auVar57 = vfmsub231ss_fma(ZEXT416((uint)(fVar73 * auVar57._0_4_ * fVar44)),auVar64,
                                ZEXT416(uVar2));
      auVar65 = vfmsub231ss_fma(ZEXT416((uint)(fVar73 * auVar65._0_4_ * fVar44)),ZEXT416(uVar3),
                                auVar64);
      auVar67 = vsubss_avx512f(auVar67,auVar59);
      auVar46 = vmulss_avx512f(auVar59,auVar52);
      auVar68 = vfmadd231ss_avx512f(auVar46,auVar67,auVar68);
      auVar46 = vmulss_avx512f(auVar59,auVar47);
      auVar46 = vfmadd231ss_fma(auVar46,auVar67,ZEXT416(uVar1));
      auVar52 = vmulss_avx512f(auVar59,auVar54);
      auVar52 = vfmadd231ss_fma(auVar52,auVar67,ZEXT416(uVar2));
      auVar53 = vmulss_avx512f(auVar59,auVar55);
      auVar53 = vfmadd231ss_fma(auVar53,auVar67,ZEXT416(uVar3));
      fVar44 = auVar46._0_4_;
      auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44)),auVar68,auVar68);
      auVar46 = vfmadd231ss_fma(auVar46,auVar52,auVar52);
      auVar46 = vfmadd231ss_fma(auVar46,auVar53,auVar53);
      auVar54 = vrsqrt14ss_avx512f(auVar58,ZEXT416((uint)auVar46._0_4_));
      fVar73 = auVar54._0_4_;
      fVar73 = fVar73 * 1.5 + fVar73 * fVar73 * fVar73 * auVar46._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar36 = 2 < uVar34;
      auVar69._4_12_ = auVar66._4_12_;
      auVar69._0_4_ =
           (float)((uint)bVar36 * (int)(auVar68._0_4_ * fVar73) + (uint)!bVar36 * auVar66._0_4_);
      auVar70._4_12_ = auVar56._4_12_;
      auVar70._0_4_ = (float)((uint)bVar36 * (int)(fVar44 * fVar73) + (uint)!bVar36 * auVar56._0_4_)
      ;
      auVar71._4_12_ = auVar57._4_12_;
      auVar71._0_4_ =
           (float)((uint)bVar36 * (int)(auVar52._0_4_ * fVar73) + (uint)!bVar36 * auVar57._0_4_);
      auVar72._4_12_ = auVar65._4_12_;
      auVar72._0_4_ =
           (float)((uint)bVar36 * (int)(auVar53._0_4_ * fVar73) + (uint)!bVar36 * auVar65._0_4_);
      auVar128._0_4_ = fVar114 * (pAVar40->l).vx.field_0.m128[0];
      auVar128._4_4_ = fVar114 * (pAVar40->l).vx.field_0.m128[1];
      auVar128._8_4_ = fVar114 * (pAVar40->l).vx.field_0.m128[2];
      auVar128._12_4_ = fVar114 * (pAVar40->l).vx.field_0.m128[3];
      uVar91 = auVar67._0_4_;
      auVar130._4_4_ = uVar91;
      auVar130._0_4_ = uVar91;
      auVar130._8_4_ = uVar91;
      auVar130._12_4_ = uVar91;
      auVar52 = vfmadd231ps_fma(auVar128,auVar130,(undefined1  [16])(pAVar37->l).vx.field_0);
      auVar125._0_4_ = fVar114 * (pAVar40->l).vy.field_0.m128[0];
      auVar125._4_4_ = fVar114 * (pAVar40->l).vy.field_0.m128[1];
      auVar125._8_4_ = fVar114 * (pAVar40->l).vy.field_0.m128[2];
      auVar125._12_4_ = fVar114 * (pAVar40->l).vy.field_0.m128[3];
      auVar53 = vfmadd231ps_fma(auVar125,auVar130,(undefined1  [16])(pAVar37->l).vy.field_0);
      auVar120._0_4_ = fVar114 * (pAVar40->l).vz.field_0.m128[0];
      auVar120._4_4_ = fVar114 * (pAVar40->l).vz.field_0.m128[1];
      auVar120._8_4_ = fVar114 * (pAVar40->l).vz.field_0.m128[2];
      auVar120._12_4_ = fVar114 * (pAVar40->l).vz.field_0.m128[3];
      auVar54 = vfmadd231ps_fma(auVar120,auVar130,(undefined1  [16])(pAVar37->l).vz.field_0);
      auVar116._0_4_ = fVar114 * (pAVar40->p).field_0.m128[0];
      auVar116._4_4_ = fVar114 * (pAVar40->p).field_0.m128[1];
      auVar116._8_4_ = fVar114 * (pAVar40->p).field_0.m128[2];
      auVar116._12_4_ = fVar114 * (pAVar40->p).field_0.m128[3];
      auVar56 = vfmadd231ps_fma(auVar116,auVar130,(undefined1  [16])(pAVar37->p).field_0);
      auVar46 = vshufps_avx(auVar52,auVar58,0xe9);
      auVar46 = vblendps_avx(auVar46,auVar53,4);
      auVar55 = vfmadd213ss_fma(auVar69,auVar69,ZEXT416((uint)(auVar70._0_4_ * auVar70._0_4_)));
      auVar55 = vfnmadd231ss_fma(auVar55,auVar71,auVar71);
      auVar57 = vfnmadd231ss_fma(auVar55,auVar72,auVar72);
      auVar55 = vfmadd213ss_fma(auVar71,auVar70,ZEXT416((uint)(auVar69._0_4_ * auVar72._0_4_)));
      fVar73 = auVar55._0_4_ + auVar55._0_4_;
      auVar55 = vfmsub213ss_fma(auVar72,auVar70,ZEXT416((uint)(auVar69._0_4_ * auVar71._0_4_)));
      fVar114 = auVar55._0_4_ + auVar55._0_4_;
      auVar55 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar72._0_4_)),auVar70,auVar71);
      fVar44 = auVar55._0_4_ + auVar55._0_4_;
      auVar47 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar70._0_4_)),auVar69,auVar69);
      auVar55 = vfmadd213ss_avx512f(auVar71,auVar71,auVar47);
      auVar65 = vfnmadd231ss_avx512f(auVar55,auVar72,auVar72);
      auVar55 = vfmadd213ss_avx512f(auVar72,auVar71,ZEXT416((uint)(auVar69._0_4_ * auVar70._0_4_)));
      auVar66 = vaddss_avx512f(auVar55,auVar55);
      auVar55 = vfmadd213ss_fma(auVar70,auVar72,ZEXT416((uint)(auVar69._0_4_ * auVar71._0_4_)));
      fVar92 = auVar55._0_4_ + auVar55._0_4_;
      auVar55 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar70._0_4_)),auVar71,auVar72);
      fVar11 = auVar55._0_4_ + auVar55._0_4_;
      auVar55 = vfnmadd231ss_fma(auVar47,auVar71,auVar71);
      auVar47 = vfmadd231ss_fma(auVar55,auVar72,auVar72);
      uVar91 = auVar57._0_4_;
      auVar87._4_4_ = uVar91;
      auVar87._0_4_ = uVar91;
      auVar87._8_4_ = uVar91;
      auVar87._12_4_ = uVar91;
      auVar99._4_4_ = fVar73;
      auVar99._0_4_ = fVar73;
      auVar99._8_4_ = fVar73;
      auVar99._12_4_ = fVar73;
      auVar135._0_4_ = fVar114 * 0.0;
      auVar135._4_4_ = fVar114 * 0.0;
      auVar135._8_4_ = fVar114 * 1.0;
      auVar135._12_4_ = fVar114 * 0.0;
      auVar67 = ZEXT816(0x3f80000000000000);
      auVar55 = vfmadd231ps_fma(auVar135,auVar67,auVar99);
      auVar68 = SUB6416(ZEXT464(0x3f800000),0);
      auVar57 = vfmadd231ps_fma(auVar55,auVar68,auVar87);
      auVar88._4_4_ = fVar44;
      auVar88._0_4_ = fVar44;
      auVar88._8_4_ = fVar44;
      auVar88._12_4_ = fVar44;
      auVar55 = vbroadcastss_avx512vl(auVar65);
      auVar65 = vbroadcastss_avx512vl(auVar66);
      auVar134._0_4_ = auVar65._0_4_ * 0.0;
      auVar134._4_4_ = auVar65._4_4_ * 0.0;
      auVar134._8_4_ = auVar65._8_4_ * 1.0;
      auVar134._12_4_ = auVar65._12_4_ * 0.0;
      auVar55 = vfmadd231ps_fma(auVar134,auVar67,auVar55);
      auVar65 = vfmadd231ps_fma(auVar55,auVar68,auVar88);
      auVar89._4_4_ = fVar92;
      auVar89._0_4_ = fVar92;
      auVar89._8_4_ = fVar92;
      auVar89._12_4_ = fVar92;
      auVar100._4_4_ = fVar11;
      auVar100._0_4_ = fVar11;
      auVar100._8_4_ = fVar11;
      auVar100._12_4_ = fVar11;
      fVar73 = auVar47._0_4_;
      auVar112._0_4_ = fVar73 * 0.0;
      auVar112._4_4_ = fVar73 * 0.0;
      auVar112._8_4_ = fVar73 * 1.0;
      auVar112._12_4_ = fVar73 * 0.0;
      auVar55 = vfmadd231ps_fma(auVar112,auVar67,auVar100);
      auVar55 = vfmadd231ps_fma(auVar55,auVar68,auVar89);
      uVar91 = auVar52._0_4_;
      auVar90._4_4_ = uVar91;
      auVar90._0_4_ = uVar91;
      auVar90._8_4_ = uVar91;
      auVar90._12_4_ = uVar91;
      fVar73 = auVar55._0_4_;
      auVar106._0_4_ = fVar73 * 0.0;
      fVar114 = auVar55._4_4_;
      auVar106._4_4_ = fVar114 * 0.0;
      fVar44 = auVar55._8_4_;
      auVar106._8_4_ = fVar44 * 0.0;
      fVar92 = auVar55._12_4_;
      auVar106._12_4_ = fVar92 * 0.0;
      auVar52 = vfmadd213ps_fma(auVar58,auVar65,auVar106);
      auVar55 = vfmadd231ps_fma(auVar52,auVar57,auVar90);
      uVar91 = auVar53._0_4_;
      auVar129._4_4_ = uVar91;
      auVar129._0_4_ = uVar91;
      auVar129._8_4_ = uVar91;
      auVar129._12_4_ = uVar91;
      auVar52 = vshufps_avx(auVar53,auVar53,0x55);
      auVar52 = vfmadd213ps_fma(auVar52,auVar65,auVar106);
      auVar47 = vfmadd231ps_fma(auVar52,auVar57,auVar129);
      uVar91 = auVar54._0_4_;
      auVar126._4_4_ = uVar91;
      auVar126._0_4_ = uVar91;
      auVar126._8_4_ = uVar91;
      auVar126._12_4_ = uVar91;
      auVar52 = vshufps_avx(auVar54,auVar54,0x55);
      auVar53 = vshufps_avx(auVar54,auVar54,0xaa);
      auVar107._0_4_ = auVar53._0_4_ * fVar73;
      auVar107._4_4_ = auVar53._4_4_ * fVar114;
      auVar107._8_4_ = auVar53._8_4_ * fVar44;
      auVar107._12_4_ = auVar53._12_4_ * fVar92;
      auVar52 = vfmadd231ps_fma(auVar107,auVar65,auVar52);
      auVar54 = vfmadd231ps_fma(auVar52,auVar57,auVar126);
      uVar91 = auVar56._0_4_;
      auVar121._4_4_ = uVar91;
      auVar121._0_4_ = uVar91;
      auVar121._8_4_ = uVar91;
      auVar121._12_4_ = uVar91;
      auVar52 = vshufps_avx(auVar56,auVar56,0x55);
      auVar53 = vshufps_avx(auVar56,auVar56,0xaa);
      auVar113._0_4_ = auVar53._0_4_ * fVar73;
      auVar113._4_4_ = auVar53._4_4_ * fVar114;
      auVar113._8_4_ = auVar53._8_4_ * fVar44;
      auVar113._12_4_ = auVar53._12_4_ * fVar92;
      auVar52 = vfmadd231ps_fma(auVar113,auVar65,auVar52);
      auVar52 = vfmadd231ps_fma(auVar52,auVar57,auVar121);
      auVar101._0_4_ = auVar46._0_4_ + 0.0 + auVar52._0_4_;
      auVar101._4_4_ = auVar46._4_4_ + 0.0 + auVar52._4_4_;
      auVar101._8_4_ = auVar46._8_4_ + 0.0 + auVar52._8_4_;
      auVar101._12_4_ = auVar46._12_4_ + 0.0 + auVar52._12_4_;
    }
    else {
      fVar73 = 1.0 - fVar114;
      auVar75._0_4_ = fVar114 * (pAVar40->l).vx.field_0.m128[0];
      auVar75._4_4_ = fVar114 * (pAVar40->l).vx.field_0.m128[1];
      auVar75._8_4_ = fVar114 * (pAVar40->l).vx.field_0.m128[2];
      auVar75._12_4_ = fVar114 * (pAVar40->l).vx.field_0.m128[3];
      auVar108._4_4_ = fVar73;
      auVar108._0_4_ = fVar73;
      auVar108._8_4_ = fVar73;
      auVar108._12_4_ = fVar73;
      auVar55 = vfmadd231ps_fma(auVar75,auVar108,(undefined1  [16])(pAVar37->l).vx.field_0);
      auVar80._0_4_ = fVar114 * (pAVar40->l).vy.field_0.m128[0];
      auVar80._4_4_ = fVar114 * (pAVar40->l).vy.field_0.m128[1];
      auVar80._8_4_ = fVar114 * (pAVar40->l).vy.field_0.m128[2];
      auVar80._12_4_ = fVar114 * (pAVar40->l).vy.field_0.m128[3];
      auVar47 = vfmadd231ps_fma(auVar80,auVar108,(undefined1  [16])(pAVar37->l).vy.field_0);
      auVar102._0_4_ = fVar114 * (pAVar40->l).vz.field_0.m128[0];
      auVar102._4_4_ = fVar114 * (pAVar40->l).vz.field_0.m128[1];
      auVar102._8_4_ = fVar114 * (pAVar40->l).vz.field_0.m128[2];
      auVar102._12_4_ = fVar114 * (pAVar40->l).vz.field_0.m128[3];
      auVar54 = vfmadd231ps_fma(auVar102,auVar108,(undefined1  [16])(pAVar37->l).vz.field_0);
      auVar93._0_4_ = fVar114 * (pAVar40->p).field_0.m128[0];
      auVar93._4_4_ = fVar114 * (pAVar40->p).field_0.m128[1];
      auVar93._8_4_ = fVar114 * (pAVar40->p).field_0.m128[2];
      auVar93._12_4_ = fVar114 * (pAVar40->p).field_0.m128[3];
      auVar101 = vfmadd231ps_fma(auVar93,auVar108,(undefined1  [16])(pAVar37->p).field_0);
    }
    auVar46 = vshufps_avx(auVar54,auVar54,0xc9);
    auVar52 = vshufps_avx(auVar47,auVar47,0xc9);
    auVar117._0_4_ = auVar54._0_4_ * auVar52._0_4_;
    auVar117._4_4_ = auVar54._4_4_ * auVar52._4_4_;
    auVar117._8_4_ = auVar54._8_4_ * auVar52._8_4_;
    auVar117._12_4_ = auVar54._12_4_ * auVar52._12_4_;
    auVar57 = vfmsub231ps_fma(auVar117,auVar47,auVar46);
    auVar53 = vshufps_avx(auVar57,auVar57,0xc9);
    auVar56 = vshufps_avx(auVar55,auVar55,0xc9);
    auVar109._0_4_ = auVar55._0_4_ * auVar46._0_4_;
    auVar109._4_4_ = auVar55._4_4_ * auVar46._4_4_;
    auVar109._8_4_ = auVar55._8_4_ * auVar46._8_4_;
    auVar109._12_4_ = auVar55._12_4_ * auVar46._12_4_;
    auVar65 = vfmsub231ps_fma(auVar109,auVar56,auVar54);
    auVar81._0_4_ = auVar56._0_4_ * auVar47._0_4_;
    auVar81._4_4_ = auVar56._4_4_ * auVar47._4_4_;
    auVar81._8_4_ = auVar56._8_4_ * auVar47._8_4_;
    auVar81._12_4_ = auVar56._12_4_ * auVar47._12_4_;
    auVar54 = vfmsub231ps_fma(auVar81,auVar55,auVar52);
    auVar46 = vshufps_avx(auVar54,auVar54,0xc9);
    auVar52 = vunpcklps_avx(auVar53,auVar46);
    auVar54 = vunpcklps_avx(auVar57,auVar54);
    auVar46 = vinsertps_avx(auVar65,auVar65,0x4a);
    auVar54 = vunpcklps_avx(auVar54,ZEXT416(auVar65._0_4_));
    auVar47 = vunpcklps_avx(auVar52,auVar46);
    auVar52 = vunpckhps_avx(auVar52,auVar46);
    auVar46 = vdpps_avx(auVar55,auVar53,0x7f);
    auVar76._0_4_ = auVar46._0_4_;
    auVar76._4_4_ = auVar76._0_4_;
    auVar76._8_4_ = auVar76._0_4_;
    auVar76._12_4_ = auVar76._0_4_;
    aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar47,auVar76);
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar52,auVar76);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar54,auVar76);
    uVar91 = auVar101._0_4_;
    auVar77._4_4_ = uVar91;
    auVar77._0_4_ = uVar91;
    auVar77._8_4_ = uVar91;
    auVar77._12_4_ = uVar91;
    auVar46 = vshufps_avx(auVar101,auVar101,0x55);
    auVar52 = vshufps_avx(auVar101,auVar101,0xaa);
    auVar94._0_4_ = auVar52._0_4_ * aVar6.m128[0];
    auVar94._4_4_ = auVar52._4_4_ * aVar6.m128[1];
    auVar94._8_4_ = auVar52._8_4_ * aVar6.m128[2];
    auVar94._12_4_ = auVar52._12_4_ * aVar6.m128[3];
    auVar46 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar5,auVar46);
    auVar46 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar4,auVar77);
    auVar22._8_4_ = 0x80000000;
    auVar22._0_8_ = 0x8000000080000000;
    auVar22._12_4_ = 0x80000000;
    aVar45 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vxorps_avx512vl(auVar46,auVar22);
  }
  if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
    local_90 = 2;
    local_78 = 0.0;
    goto LAB_01fdfc91;
  }
  auVar46 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar5,0x7f);
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar46 = vandps_avx512vl(auVar46,auVar15);
  local_78 = 0.0;
  if (1e-05 < auVar46._0_4_) {
LAB_01fdfc79:
    bVar36 = false;
  }
  else {
    auVar46 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar6,0x7f);
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar46 = vandps_avx512vl(auVar46,auVar16);
    if (1e-05 < auVar46._0_4_) goto LAB_01fdfc79;
    auVar46 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar6,0x7f);
    auVar17._8_4_ = 0x7fffffff;
    auVar17._0_8_ = 0x7fffffff7fffffff;
    auVar17._12_4_ = 0x7fffffff;
    auVar46 = vandps_avx512vl(auVar46,auVar17);
    if (1e-05 < auVar46._0_4_) goto LAB_01fdfc79;
    auVar52 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    auVar53 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    fVar73 = auVar52._0_4_;
    auVar110._8_4_ = 0x7fffffff;
    auVar110._0_8_ = 0x7fffffff7fffffff;
    auVar110._12_4_ = 0x7fffffff;
    auVar46 = vandps_avx(ZEXT416((uint)(fVar73 - auVar53._0_4_)),auVar110);
    bVar36 = false;
    if (auVar46._0_4_ <= 1e-05) {
      auVar54 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar46 = vandps_avx(ZEXT416((uint)(fVar73 - auVar54._0_4_)),auVar110);
      bVar36 = false;
      if (auVar46._0_4_ <= 1e-05) {
        auVar21._8_4_ = 0x7fffffff;
        auVar21._0_8_ = 0x7fffffff7fffffff;
        auVar21._12_4_ = 0x7fffffff;
        auVar46 = vandps_avx512vl(ZEXT416((uint)(auVar53._0_4_ - auVar54._0_4_)),auVar21);
        bVar36 = auVar46._0_4_ <= 1e-05;
        if (auVar46._0_4_ <= 1e-05) {
          bVar36 = true;
          if (fVar73 < 0.0) {
            local_78 = sqrtf(fVar73);
          }
          else {
            auVar46 = vsqrtss_avx(auVar52,auVar52);
            local_78 = auVar46._0_4_;
          }
        }
      }
    }
  }
  local_90 = 2 - (uint)bVar36;
LAB_01fdfc91:
  pRVar8 = context->userContext;
  uVar35 = pRVar8->instStackSize;
  pRVar8->instID[uVar35] = prim->instID_;
  pRVar8->instPrimID[uVar35] = 0;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)pRVar8->world2inst[uVar35] = aVar4;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pRVar8->world2inst[uVar35] + 4) = aVar5;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pRVar8->world2inst[uVar35] + 8) = aVar6;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pRVar8->world2inst[uVar35] + 0xc) = aVar45;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)pRVar8->inst2world[uVar35] = aVar48;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pRVar8->inst2world[uVar35] + 4) = aVar49;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pRVar8->inst2world[uVar35] + 8) = aVar50;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pRVar8->inst2world[uVar35] + 0xc) = aVar51;
  pRVar8->instStackSize = pRVar8->instStackSize + 1;
  local_dc = query->time;
  uVar91 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  auVar18._4_4_ = uVar91;
  auVar18._0_4_ = uVar91;
  auVar18._8_4_ = uVar91;
  auVar18._12_4_ = uVar91;
  auVar46 = vfmadd132ps_avx512vl((undefined1  [16])aVar6,(undefined1  [16])aVar45,auVar18);
  uVar91 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  auVar19._4_4_ = uVar91;
  auVar19._0_4_ = uVar91;
  auVar19._8_4_ = uVar91;
  auVar19._12_4_ = uVar91;
  auVar46 = vfmadd231ps_avx512vl(auVar46,(undefined1  [16])aVar5,auVar19);
  uVar91 = *(undefined4 *)&(query->p).field_0;
  auVar20._4_4_ = uVar91;
  auVar20._0_4_ = uVar91;
  auVar20._8_4_ = uVar91;
  auVar20._12_4_ = uVar91;
  auVar46 = vfmadd231ps_avx512vl(auVar46,(undefined1  [16])aVar4,auVar20);
  local_e8 = vmovlps_avx(auVar46);
  local_e0 = vextractps_avx(auVar46,2);
  local_d8 = local_78 * query->radius;
  local_a8 = *(undefined8 *)&(pIVar7->super_Geometry).field_0x58;
  local_98 = context->query_ws;
  local_70 = context->userPtr;
  local_a0 = 0;
  local_88._0_8_ = context->func;
  local_88._8_8_ = context->userContext;
  local_68 = 0xffffffffffffffff;
  local_58._4_4_ = local_98->radius;
  local_58._0_4_ = local_58._4_4_;
  fStack_50 = (float)local_58._4_4_;
  fStack_4c = (float)local_58._4_4_;
  fVar73 = local_98->radius;
  if (local_90 == 2) {
    if ((INFINITY <= fVar73) || (lVar38 = vpextrq_avx(local_88,1), *(int *)(lVar38 + 0x88) == 0)) {
      local_48._4_4_ = fVar73;
      local_48._0_4_ = fVar73;
      local_48._8_4_ = fVar73;
      local_48._12_4_ = fVar73;
    }
    else {
      pointQuery();
    }
  }
  else {
    fVar73 = local_78 * fVar73;
    local_48._4_4_ = fVar73;
    local_48._0_4_ = fVar73;
    local_48._8_4_ = fVar73;
    local_48._12_4_ = fVar73;
  }
  lVar38 = *(long *)&(pIVar7->super_Geometry).field_0x58;
  _local_58 = local_48;
  uVar33 = (**(code **)(lVar38 + 0x88))(lVar38 + 0x58,&local_e8);
  pRVar8 = context->userContext;
  uVar35 = pRVar8->instStackSize - 1;
  pRVar8->instStackSize = uVar35;
  pRVar8->instID[uVar35] = 0xffffffff;
  pRVar8->instPrimID[pRVar8->instStackSize] = 0xffffffff;
  return (bool)uVar33;
}

Assistant:

bool InstanceIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World(query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;
        
        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }